

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3GetDeltaVarint3(char **pp,char *pEnd,int bDescIdx,sqlite3_int64 *pVal)

{
  int iVar1;
  long local_30;
  sqlite3_int64 iVal;
  sqlite3_int64 *pVal_local;
  char *pcStack_18;
  int bDescIdx_local;
  char *pEnd_local;
  char **pp_local;
  
  if (*pp < pEnd) {
    iVal = (sqlite3_int64)pVal;
    pVal_local._4_4_ = bDescIdx;
    pcStack_18 = pEnd;
    pEnd_local = (char *)pp;
    iVar1 = sqlite3Fts3GetVarint(*pp,&local_30);
    *(long *)pEnd_local = *(long *)pEnd_local + (long)iVar1;
    if (pVal_local._4_4_ == 0) {
      *(long *)iVal = local_30 + *(long *)iVal;
    }
    else {
      *(long *)iVal = *(long *)iVal - local_30;
    }
  }
  else {
    *pp = (char *)0x0;
  }
  return;
}

Assistant:

static void fts3GetDeltaVarint3(
  char **pp,                      /* IN/OUT: Point to read varint from */
  char *pEnd,                     /* End of buffer */
  int bDescIdx,                   /* True if docids are descending */
  sqlite3_int64 *pVal             /* IN/OUT: Integer value */
){
  if( *pp>=pEnd ){
    *pp = 0;
  }else{
    sqlite3_int64 iVal;
    *pp += sqlite3Fts3GetVarint(*pp, &iVal);
    if( bDescIdx ){
      *pVal -= iVal;
    }else{
      *pVal += iVal;
    }
  }
}